

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::verifyXFBData
          (FunctionalTest18_19 *this,GLvoid *data,GLuint bool_operator1_subroutine_location,
          GLuint bool_operator2_subroutine_location,GLuint vec4_operator1_subroutine_location,
          GLuint vec4_operator2_subroutine_location)

{
  float fVar1;
  float fVar2;
  GLfloat *pGVar3;
  PFNVEC4OPERATORPROC p_Var4;
  float *pfVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  float fVar7;
  undefined8 extraout_XMM0_Qa;
  ulong uVar8;
  Vec4 VVar9;
  byte local_27d;
  GLfloat *local_278;
  PFNVEC4OPERATORPROC local_270;
  MessageBuilder local_250;
  Vector<float,_4> local_cc;
  undefined1 local_bc [32];
  uint local_9c;
  uint iteration_1;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  undefined1 auStack_64 [4];
  uint iteration;
  Vec4 value_1;
  float value;
  float expected_value;
  uint n_vertex;
  GLfloat *traveller_ptr;
  PFNVEC4OPERATORPROC pVec4Operator2;
  PFNVEC4OPERATORPROC pVec4Operator1;
  float epsilon;
  bool bool_operator2_result;
  GLuint GStack_24;
  bool bool_operator1_result;
  GLuint vec4_operator2_subroutine_location_local;
  GLuint vec4_operator1_subroutine_location_local;
  GLuint bool_operator2_subroutine_location_local;
  GLuint bool_operator1_subroutine_location_local;
  GLvoid *data_local;
  FunctionalTest18_19 *this_local;
  Vec4 VVar10;
  
  pVec4Operator1._0_4_ = 0x3727c5ac;
  pVec4Operator1._7_1_ =
       bool_operator1_subroutine_location == this->m_po_subroutine_returns_true_location;
  pVec4Operator1._6_1_ =
       bool_operator2_subroutine_location == this->m_po_subroutine_returns_true_location;
  if (vec4_operator1_subroutine_location == this->m_po_subroutine_divide_by_two_location) {
    local_270 = vec4operator_div2;
  }
  else {
    local_270 = vec4operator_mul4;
  }
  pVec4Operator2 = local_270;
  if (vec4_operator2_subroutine_location == this->m_po_subroutine_divide_by_two_location) {
    local_278 = (GLfloat *)vec4operator_div2;
  }
  else {
    local_278 = (GLfloat *)vec4operator_mul4;
  }
  traveller_ptr = local_278;
  value = 0.0;
  _expected_value = (float *)data;
  epsilon = (float)vec4_operator2_subroutine_location;
  GStack_24 = vec4_operator1_subroutine_location;
  vec4_operator2_subroutine_location_local = bool_operator2_subroutine_location;
  vec4_operator1_subroutine_location_local = bool_operator1_subroutine_location;
  _bool_operator2_subroutine_location_local = data;
  data_local = this;
  do {
    if (this->m_n_points_to_draw <= (uint)value) {
      return;
    }
    value_1.m_data[3] = 0.0;
    if ((pVec4Operator1._7_1_ & 1) == 0) {
      fVar7 = (float)(uint)value;
      uVar8 = (ulong)(uint)(fVar7 + 1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)auStack_64,fVar7,fVar7 + 1.0,fVar7 + 2.0,fVar7 + 3.0);
      if (((uint)value & 1) == 0) {
        local_68 = 0.0;
        while( true ) {
          p_Var4 = pVec4Operator2;
          pGVar3 = traveller_ptr;
          local_27d = 0;
          if ((uint)local_68 < (uint)value) {
            local_27d = pVec4Operator1._6_1_;
          }
          if ((local_27d & 1) == 0) break;
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)&stack0xffffffffffffff68,(Vector<float,_4> *)auStack_64);
          VVar9.m_data[2] = (float)(int)uVar8;
          VVar9.m_data[3] = (float)(int)(uVar8 >> 0x20);
          VVar9.m_data[0] = (float)(int)extraout_XMM0_Qa;
          VVar9.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
          VVar9 = (*p_Var4)(VVar9);
          uVar8 = VVar9.m_data._8_8_;
          (*(code *)pGVar3)(VVar9.m_data._0_8_,local_78,local_88);
          local_68 = (float)((int)local_68 + 1);
        }
      }
      else if (((uint)value & 1) == 1) {
        for (local_9c = 0; p_Var4 = pVec4Operator2, pGVar3 = traveller_ptr,
            local_9c < (uint)((int)value << 1); local_9c = local_9c + 1) {
          tcu::Vector<float,_4>::Vector(&local_cc,(Vector<float,_4> *)auStack_64);
          VVar10.m_data._0_8_ = (*(code *)pGVar3)(local_bc,&local_cc);
          VVar10.m_data[2] = (float)(int)uVar8;
          VVar10.m_data[3] = (float)(int)(uVar8 >> 0x20);
          VVar9 = (*p_Var4)(VVar10);
          uVar8 = VVar9.m_data._8_8_;
        }
      }
      pfVar5 = tcu::Vector<float,_4>::x((Vector<float,_4> *)auStack_64);
      fVar7 = *pfVar5;
      pfVar5 = tcu::Vector<float,_4>::y((Vector<float,_4> *)auStack_64);
      fVar1 = *pfVar5;
      pfVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)auStack_64);
      fVar2 = *pfVar5;
      pfVar5 = tcu::Vector<float,_4>::w((Vector<float,_4> *)auStack_64);
      value_1.m_data[3] = fVar7 + fVar1 + fVar2 + *pfVar5;
    }
    else {
      value_1.m_data[2] = (float)((int)value * 6 + 2);
      do {
        if ((pVec4Operator1._7_1_ & 1) == 0) break;
        value_1.m_data[2] = value_1.m_data[2] / (float)((int)value + 2);
      } while (1.0 < value_1.m_data[2]);
      value_1.m_data[3] = value_1.m_data[2];
    }
    fVar7 = de::abs<float>(value_1.m_data[3] - *_expected_value);
    if (1e-05 < fVar7) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_250,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_250,(char (*) [46])"XFBed data was found to be invalid at index [")
      ;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&value);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [91])
                                 "]for the following subroutine location configuration: bool_operator1_subroutine_location:["
                         );
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&vec4_operator1_subroutine_location_local);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [39])"] bool_operator2_subroutine_location:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&vec4_operator2_subroutine_location_local);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [39])"] vec4_operator1_subroutine_location:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&stack0xffffffffffffffdc);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [39])"] vec4_operator2_subroutine_location:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&epsilon);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])"]; expected data:");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value_1.m_data + 3);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", found:");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,_expected_value);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_250);
      this->m_has_test_passed = false;
    }
    _expected_value = _expected_value + 1;
    value = (float)((int)value + 1);
  } while( true );
}

Assistant:

void FunctionalTest18_19::verifyXFBData(const glw::GLvoid* data, glw::GLuint bool_operator1_subroutine_location,
										glw::GLuint bool_operator2_subroutine_location,
										glw::GLuint vec4_operator1_subroutine_location,
										glw::GLuint vec4_operator2_subroutine_location)
{
	bool				bool_operator1_result = false;
	bool				bool_operator2_result = false;
	const float			epsilon				  = 1e-5f;
	PFNVEC4OPERATORPROC pVec4Operator1		  = NULL;
	PFNVEC4OPERATORPROC pVec4Operator2		  = NULL;
	const glw::GLfloat* traveller_ptr		  = (const glw::GLfloat*)data;

	bool_operator1_result = (bool_operator1_subroutine_location == m_po_subroutine_returns_true_location);
	bool_operator2_result = (bool_operator2_subroutine_location == m_po_subroutine_returns_true_location);
	pVec4Operator1		  = (vec4_operator1_subroutine_location == m_po_subroutine_divide_by_two_location) ?
						 vec4operator_div2 :
						 vec4operator_mul4;
	pVec4Operator2 = (vec4_operator2_subroutine_location == m_po_subroutine_divide_by_two_location) ?
						 vec4operator_div2 :
						 vec4operator_mul4;

	for (unsigned int n_vertex = 0; n_vertex < m_n_points_to_draw; ++n_vertex)
	{
		float expected_value = 0.0f;

		if (bool_operator1_result)
		{
			float value = float((3 * n_vertex + 1) * 2);

			while (bool_operator1_result)
			{
				value /= float(n_vertex + 2);

				if (value <= 1.0f)
					break;
			}

			expected_value = value;
		}
		else
		{
			tcu::Vec4 value((float)n_vertex, (float)n_vertex + 1, (float)n_vertex + 2, (float)n_vertex + 3);

			switch (n_vertex % 2)
			{
			case 0:
			{
				for (unsigned int iteration = 0; iteration < n_vertex && bool_operator2_result; ++iteration)
				{
					value = pVec4Operator2(pVec4Operator1(value));
				}

				break;
			}

			case 1:
			{
				for (unsigned int iteration = 0; iteration < n_vertex * 2; ++iteration)
				{
					value = pVec4Operator1(pVec4Operator2(value));
				}

				break;
			}
			} /* switch (n_vertex % 2) */

			expected_value = value.x() + value.y() + value.z() + value.w();
		}

		if (de::abs(expected_value - *traveller_ptr) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "XFBed data was found to be invalid at index [" << n_vertex
							   << "]"
								  "for the following subroutine location configuration:"
								  " bool_operator1_subroutine_location:["
							   << bool_operator1_subroutine_location << "]"
																		" bool_operator2_subroutine_location:["
							   << bool_operator2_subroutine_location << "]"
																		" vec4_operator1_subroutine_location:["
							   << vec4_operator1_subroutine_location << "]"
																		" vec4_operator2_subroutine_location:["
							   << vec4_operator2_subroutine_location << "];"
																		" expected data:"
							   << expected_value << ", found:" << *traveller_ptr << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		++traveller_ptr;
	} /* for (all drawn points) */
}